

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlElementContentPtr xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt,int inputchk)

{
  bool bVar1;
  xmlElementContentPtr pxVar2;
  xmlElementContentPtr pxVar3;
  xmlChar *local_40;
  xmlChar *elem;
  xmlElementContentPtr n;
  xmlElementContentPtr cur;
  xmlElementContentPtr ret;
  int inputchk_local;
  xmlParserCtxtPtr ctxt_local;
  
  cur = (xmlElementContentPtr)0x0;
  local_40 = (xmlChar *)0x0;
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  if (((((*ctxt->input->cur == '#') && (ctxt->input->cur[1] == 'P')) && (ctxt->input->cur[2] == 'C')
       ) && ((ctxt->input->cur[3] == 'D' && (ctxt->input->cur[4] == 'A')))) &&
     ((ctxt->input->cur[5] == 'T' && (ctxt->input->cur[6] == 'A')))) {
    ctxt->input->cur = ctxt->input->cur + 7;
    ctxt->input->col = ctxt->input->col + 7;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    if (*ctxt->input->cur == ')') {
      if (ctxt->input->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      pxVar2 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      if (pxVar2 != (xmlElementContentPtr)0x0) {
        if (*ctxt->input->cur != '*') {
          return pxVar2;
        }
        pxVar2->ocur = XML_ELEMENT_CONTENT_MULT;
        xmlNextChar(ctxt);
        return pxVar2;
      }
      cur = (xmlElementContentPtr)0x0;
    }
    else if (((*ctxt->input->cur != '(') && (n = cur, *ctxt->input->cur != '|')) ||
            (cur = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA),
            n = cur, cur != (xmlElementContentPtr)0x0)) {
      while( true ) {
        bVar1 = false;
        if (*ctxt->input->cur == '|') {
          bVar1 = ctxt->disableSAX < 2;
        }
        if (!bVar1) break;
        xmlNextChar(ctxt);
        pxVar2 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
        if (pxVar2 == (xmlElementContentPtr)0x0) goto LAB_001452ef;
        if (local_40 == (xmlChar *)0x0) {
          pxVar2->c1 = n;
          cur = pxVar2;
          if (n != (xmlElementContentPtr)0x0) {
            n->parent = pxVar2;
          }
        }
        else {
          n->c2 = pxVar2;
          pxVar2->parent = n;
          pxVar3 = xmlNewDocElementContent(ctxt->myDoc,local_40,XML_ELEMENT_CONTENT_ELEMENT);
          pxVar2->c1 = pxVar3;
          if (pxVar2->c1 == (_xmlElementContent *)0x0) goto LAB_001452ef;
          pxVar2->c1->parent = pxVar2;
        }
        xmlSkipBlankCharsPE(ctxt);
        local_40 = xmlParseName(ctxt);
        if (local_40 == (xmlChar *)0x0) {
          xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,
                         "xmlParseElementMixedContentDecl : Name expected\n");
          xmlFreeDocElementContent(ctxt->myDoc,cur);
          return (xmlElementContentPtr)0x0;
        }
        xmlSkipBlankCharsPE(ctxt);
        n = pxVar2;
        if (((ctxt->input->flags & 0x40U) == 0) &&
           ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      }
      if ((*ctxt->input->cur != ')') || (ctxt->input->cur[1] != '*')) {
        xmlFreeDocElementContent(ctxt->myDoc,cur);
        xmlFatalErr(ctxt,XML_ERR_MIXED_NOT_STARTED,(char *)0x0);
        return (xmlElementContentPtr)0x0;
      }
      if (local_40 != (xmlChar *)0x0) {
        pxVar2 = xmlNewDocElementContent(ctxt->myDoc,local_40,XML_ELEMENT_CONTENT_ELEMENT);
        n->c2 = pxVar2;
        if (n->c2 == (_xmlElementContent *)0x0) goto LAB_001452ef;
        n->c2->parent = n;
      }
      if (cur != (xmlElementContentPtr)0x0) {
        cur->ocur = XML_ELEMENT_CONTENT_MULT;
      }
      if (ctxt->input->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      ctxt->input->cur = ctxt->input->cur + 2;
      ctxt->input->col = ctxt->input->col + 2;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
      goto LAB_001452e5;
    }
LAB_001452ef:
    xmlErrMemory(ctxt);
    xmlFreeDocElementContent(ctxt->myDoc,cur);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_PCDATA_REQUIRED,(char *)0x0);
LAB_001452e5:
    ctxt_local = (xmlParserCtxtPtr)cur;
  }
  return (xmlElementContentPtr)ctxt_local;
}

Assistant:

xmlElementContentPtr
xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt, int inputchk) {
    xmlElementContentPtr ret = NULL, cur = NULL, n;
    const xmlChar *elem = NULL;

    GROW;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
	SKIP(7);
	SKIP_BLANKS_PE;
	if (RAW == ')') {
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	    ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
                goto mem_error;
	    if (RAW == '*') {
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    }
	    return(ret);
	}
	if ((RAW == '(') || (RAW == '|')) {
	    ret = cur = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
                goto mem_error;
	}
	while ((RAW == '|') && (PARSER_STOPPED(ctxt) == 0)) {
	    NEXT;
            n = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
            if (n == NULL)
                goto mem_error;
	    if (elem == NULL) {
		n->c1 = cur;
		if (cur != NULL)
		    cur->parent = n;
		ret = cur = n;
	    } else {
	        cur->c2 = n;
		n->parent = cur;
		n->c1 = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
                if (n->c1 == NULL)
                    goto mem_error;
		n->c1->parent = n;
		cur = n;
	    }
	    SKIP_BLANKS_PE;
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			"xmlParseElementMixedContentDecl : Name expected\n");
		xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    SKIP_BLANKS_PE;
	    GROW;
	}
	if ((RAW == ')') && (NXT(1) == '*')) {
	    if (elem != NULL) {
		cur->c2 = xmlNewDocElementContent(ctxt->myDoc, elem,
		                               XML_ELEMENT_CONTENT_ELEMENT);
		if (cur->c2 == NULL)
                    goto mem_error;
		cur->c2->parent = cur;
            }
            if (ret != NULL)
                ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    SKIP(2);
	} else {
	    xmlFreeDocElementContent(ctxt->myDoc, ret);
	    xmlFatalErr(ctxt, XML_ERR_MIXED_NOT_STARTED, NULL);
	    return(NULL);
	}

    } else {
	xmlFatalErr(ctxt, XML_ERR_PCDATA_REQUIRED, NULL);
    }
    return(ret);

mem_error:
    xmlErrMemory(ctxt);
    xmlFreeDocElementContent(ctxt->myDoc, ret);
    return(NULL);
}